

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

size_t __thiscall caffe::PythonParameter::ByteSizeLong(PythonParameter *this)

{
  uint uVar1;
  void *pvVar2;
  size_type sVar3;
  int iVar4;
  size_t sVar5;
  uint uVar6;
  
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    sVar5 = 0;
  }
  else {
    sVar5 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize
                      ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar3 = ((this->module_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar5 = sVar5 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar3 = ((this->layer_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar5 = sVar5 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 4) != 0) {
      sVar3 = ((this->param_str_).ptr_)->_M_string_length;
      uVar6 = (uint)sVar3 | 1;
      iVar4 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar5 = sVar5 + sVar3 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
    }
    sVar5 = sVar5 + (uVar1 >> 2 & 2);
  }
  this->_cached_size_ = (int)sVar5;
  return sVar5;
}

Assistant:

size_t PythonParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.PythonParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 15u) {
    // optional string module = 1;
    if (has_module()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->module());
    }

    // optional string layer = 2;
    if (has_layer()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->layer());
    }

    // optional string param_str = 3 [default = ""];
    if (has_param_str()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->param_str());
    }

    // optional bool share_in_parallel = 4 [default = false];
    if (has_share_in_parallel()) {
      total_size += 1 + 1;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}